

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderBuiltinVarTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::ShaderBuiltinConstantCase::init
          (ShaderBuiltinConstantCase *this,EVP_PKEY_CTX *ctx)

{
  undefined1 *this_00;
  int iVar1;
  ostream *poVar2;
  MessageBuilder *this_01;
  int precision;
  char *pcVar3;
  string *ctx_00;
  allocator<char> local_1ca;
  allocator<char> local_1c9;
  string local_1c8;
  ostringstream src;
  
  iVar1 = getRefValue(this);
  src.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)((this->super_ShaderRenderCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  this_00 = &src.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,(string *)&this->m_varName);
  std::operator<<((ostream *)this_00," = ");
  std::ostream::operator<<(this_00,iVar1);
  this_01 = (MessageBuilder *)&src;
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
  if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
    poVar2 = std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,
                             "attribute highp vec4 a_position;\n");
    this_01 = (MessageBuilder *)std::operator<<(poVar2,"attribute highp vec4 a_coords;\n");
    pcVar3 = "varying mediump vec4 v_color;\n";
  }
  else {
    pcVar3 = "varying mediump vec4 v_coords;\n";
  }
  std::operator<<((ostream *)this_01,pcVar3);
  std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,"void main (void)\n{\n");
  poVar2 = std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,"\tbool isOk = ")
  ;
  poVar2 = std::operator<<(poVar2,(string *)&this->m_varName);
  poVar2 = std::operator<<(poVar2," == (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2," + int(floor(");
  pcVar3 = "v_coords";
  if ((this->super_ShaderRenderCase).m_isVertexCase != false) {
    pcVar3 = "a_coords";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,".x * ");
  de::floatToString_abi_cxx11_(&local_1c8,(de *)&DAT_00000001,4.0,precision);
  poVar2 = std::operator<<(poVar2,(string *)&local_1c8);
  std::operator<<(poVar2,") + 0.05));\n");
  std::__cxx11::string::~string((string *)&local_1c8);
  poVar2 = std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,"\t");
  pcVar3 = "gl_FragColor";
  if ((this->super_ShaderRenderCase).m_isVertexCase != false) {
    pcVar3 = "v_color";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2," = isOk ? vec4(0.0, 1.0, 0.0, 1.0) : vec4(1.0, 0.0, 0.0, 1.0);\n");
  if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
    std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,
                    "\tgl_Position = a_position;\n");
  }
  std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
    std::__cxx11::stringbuf::str();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,
               "attribute highp vec4 a_position;\nattribute highp vec4 a_coords;\nvarying mediump vec4 v_coords;\n\nvoid main (void)\n{\n\tv_coords = a_coords;\n\tgl_Position = a_position;\n}\n"
               ,&local_1c9);
  }
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,(string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,
               "varying mediump vec4 v_color;\n\nvoid main (void)\n{\n\tgl_FragColor = v_color;\n}\n"
               ,&local_1ca);
  }
  else {
    std::__cxx11::stringbuf::str();
  }
  ctx_00 = &local_1c8;
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,(string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,(EVP_PKEY_CTX *)ctx_00);
  iVar1 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  return iVar1;
}

Assistant:

void ShaderBuiltinConstantCase::init (void)
{
	const int refValue = getRefValue();
	m_testCtx.getLog() << tcu::TestLog::Message << m_varName << " = " << refValue << tcu::TestLog::EndMessage;

	static const char* defaultVertSrc =
		"attribute highp vec4 a_position;\n"
		"attribute highp vec4 a_coords;\n"
		"varying mediump vec4 v_coords;\n\n"
		"void main (void)\n"
		"{\n"
		"	v_coords = a_coords;\n"
		"	gl_Position = a_position;\n"
		"}\n";
	static const char* defaultFragSrc =
		"varying mediump vec4 v_color;\n\n"
		"void main (void)\n"
		"{\n"
		"	gl_FragColor = v_color;\n"
		"}\n";

	// Construct shader.
	std::ostringstream src;
	if (m_isVertexCase)
	{
		src << "attribute highp vec4 a_position;\n"
			<< "attribute highp vec4 a_coords;\n"
			<< "varying mediump vec4 v_color;\n";
	}
	else
		src << "varying mediump vec4 v_coords;\n";

	src << "void main (void)\n{\n";

	src << "\tbool isOk = " << m_varName << " == (" << refValue << " + int(floor(" << (m_isVertexCase ? "a_coords" : "v_coords") << ".x * " << de::floatToString(builtinConstScale, 1) << ") + 0.05));\n";
	src << "\t" << (m_isVertexCase ? "v_color" : "gl_FragColor") << " = isOk ? vec4(0.0, 1.0, 0.0, 1.0) : vec4(1.0, 0.0, 0.0, 1.0);\n";

	if (m_isVertexCase)
		src << "\tgl_Position = a_position;\n";

	src << "}\n";

	m_vertShaderSource		= m_isVertexCase ? src.str()		: defaultVertSrc;
	m_fragShaderSource		= m_isVertexCase ? defaultFragSrc	: src.str();

	gls::ShaderRenderCase::init();
}